

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

CharString * __thiscall icu_63::CharString::append(CharString *this,char c,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  char *pcVar3;
  UErrorCode *errorCode_local;
  char c_local;
  CharString *this_local;
  
  UVar2 = ensureCapacity(this,this->len + 2,0,errorCode);
  if (UVar2 != '\0') {
    iVar1 = this->len;
    this->len = iVar1 + 1;
    pcVar3 = MaybeStackArray<char,_40>::operator[](&this->buffer,(long)iVar1);
    *pcVar3 = c;
    pcVar3 = MaybeStackArray<char,_40>::operator[](&this->buffer,(long)this->len);
    *pcVar3 = '\0';
  }
  return this;
}

Assistant:

CharString &CharString::append(char c, UErrorCode &errorCode) {
    if(ensureCapacity(len+2, 0, errorCode)) {
        buffer[len++]=c;
        buffer[len]=0;
    }
    return *this;
}